

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  agc_t *agc;
  bool bVar1;
  model_def_t *pmVar2;
  feat_t *pfVar3;
  cmn_type_t cmn;
  agc_type_t agc_00;
  int32 iVar4;
  int iVar5;
  cmd_ln_t *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  int32 **subvecs;
  uint32 *puVar11;
  cmn_t *pcVar12;
  double dVar13;
  uint32 n_cb;
  uint32 n_ts;
  uint32 local_40;
  uint32 local_3c;
  char *local_38;
  
  parse_cmd_ln(argc,argv);
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-feat");
  pcVar6 = cmd_ln_get();
  pcVar8 = cmd_ln_str_r(pcVar6,"-cmn");
  cmn = cmn_type_from_str(pcVar8);
  pcVar6 = cmd_ln_get();
  lVar9 = cmd_ln_int_r(pcVar6,"-varnorm");
  pcVar6 = cmd_ln_get();
  pcVar8 = cmd_ln_str_r(pcVar6,"-agc");
  agc_00 = agc_type_from_str(pcVar8);
  pcVar6 = cmd_ln_get();
  lVar10 = cmd_ln_int_r(pcVar6,"-ceplen");
  feat = feat_init(pcVar7,cmn,(uint)(lVar9 != 0),agc_00,1,(int32)lVar10);
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-lda");
  if (pcVar7 != (char *)0x0) {
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-lda");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
            ,0x60,"Reading linear feature transformation from %s\n",pcVar7);
    pfVar3 = feat;
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-lda");
    pcVar6 = cmd_ln_get();
    lVar9 = cmd_ln_int_r(pcVar6,"-ldadim");
    iVar4 = feat_read_lda(pfVar3,pcVar7,(int32)lVar9);
    if (iVar4 < 0) goto LAB_00103c5c;
  }
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-svspec");
  if (pcVar7 != (char *)0x0) {
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-svspec");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
            ,0x6a,"Using subvector specification %s\n",pcVar7);
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-svspec");
    subvecs = parse_subvecs(pcVar7);
    if ((subvecs == (int32 **)0x0) || (iVar5 = feat_set_subvecs(feat,subvecs), iVar5 < 0))
    goto LAB_00103c5c;
  }
  pcVar6 = cmd_ln_get();
  iVar5 = cmd_ln_exists_r(pcVar6,"-agcthresh");
  if (iVar5 != 0) {
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-agc");
    iVar5 = strcmp(pcVar7,"none");
    if (iVar5 != 0) {
      agc = feat->agc_struct;
      pcVar6 = cmd_ln_get();
      dVar13 = cmd_ln_float_r(pcVar6,"-agcthresh");
      agc_set_threshold(agc,(float32)(float)dVar13);
    }
  }
  if (feat->cmn_struct != (cmn_t *)0x0) {
    pcVar6 = cmd_ln_get();
    iVar5 = cmd_ln_exists_r(pcVar6,"-cmninit");
    if (iVar5 != 0) {
      pcVar6 = cmd_ln_get();
      pcVar7 = cmd_ln_str_r(pcVar6,"-cmninit");
      pcVar7 = __ckd_salloc__(pcVar7,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
                              ,0x7c);
      pfVar3 = feat;
      pcVar12 = feat->cmn_struct;
      bVar1 = 0 < pcVar12->veclen;
      local_38 = pcVar7;
      if (0 < pcVar12->veclen) {
        pcVar8 = strchr(pcVar7,0x2c);
        if (pcVar8 == (char *)0x0) {
          lVar9 = 0;
        }
        else {
          lVar9 = 0;
          do {
            *pcVar8 = '\0';
            dVar13 = atof(pcVar7);
            pcVar12 = pfVar3->cmn_struct;
            pcVar12->cmn_mean[lVar9] = (mfcc_t)(float)dVar13;
            lVar9 = lVar9 + 1;
            bVar1 = lVar9 < pcVar12->veclen;
            if (pcVar12->veclen <= lVar9) goto LAB_00103a8c;
            pcVar7 = pcVar8 + 1;
            pcVar8 = strchr(pcVar7,0x2c);
          } while (pcVar8 != (char *)0x0);
        }
        if ((bVar1) && (*pcVar7 != '\0')) {
          dVar13 = atof(pcVar7);
          pcVar12->cmn_mean[lVar9] = (mfcc_t)(float)dVar13;
        }
      }
LAB_00103a8c:
      ckd_free(local_38);
    }
  }
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-segdir");
  if (pcVar7 != (char *)0x0) {
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-segdir");
    corpus_set_seg_dir(pcVar7);
  }
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-segext");
  if (pcVar7 != (char *)0x0) {
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-segext");
    corpus_set_seg_ext(pcVar7);
  }
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-cepdir");
  corpus_set_mfcc_dir(pcVar7);
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-cepext");
  corpus_set_mfcc_ext(pcVar7);
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-lsnfn");
  if (pcVar7 != (char *)0x0) {
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-lsnfn");
    corpus_set_lsn_filename(pcVar7);
  }
  pcVar6 = cmd_ln_get();
  pcVar7 = cmd_ln_str_r(pcVar6,"-ctlfn");
  corpus_set_ctl_filename(pcVar7);
  pcVar6 = cmd_ln_get();
  lVar9 = cmd_ln_int_r(pcVar6,"-nskip");
  if ((int)lVar9 == 0) {
LAB_00103bef:
    pcVar6 = cmd_ln_get();
    lVar9 = cmd_ln_int_r(pcVar6,"-part");
    if ((int)lVar9 != 0) {
      pcVar6 = cmd_ln_get();
      lVar9 = cmd_ln_int_r(pcVar6,"-npart");
      if ((int)lVar9 != 0) {
        pcVar6 = cmd_ln_get();
        lVar9 = cmd_ln_int_r(pcVar6,"-part");
        pcVar6 = cmd_ln_get();
        lVar10 = cmd_ln_int_r(pcVar6,"-npart");
        corpus_set_partition((uint32)lVar9,(uint32)lVar10);
      }
    }
  }
  else {
    pcVar6 = cmd_ln_get();
    lVar9 = cmd_ln_int_r(pcVar6,"-runlen");
    if ((int)lVar9 == 0) goto LAB_00103bef;
    pcVar6 = cmd_ln_get();
    lVar9 = cmd_ln_int_r(pcVar6,"-nskip");
    pcVar6 = cmd_ln_get();
    lVar10 = cmd_ln_int_r(pcVar6,"-runlen");
    corpus_set_interval((uint32)lVar9,(uint32)lVar10);
  }
  iVar5 = corpus_init();
  if (iVar5 == 0) {
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-moddeffn");
    if (pcVar7 == (char *)0x0) {
LAB_00103eb2:
      iVar5 = init_gau(lex,mdef,feat);
      return (uint)(iVar5 != 0);
    }
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-moddeffn");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
            ,0xa8,"Reading %s\n",pcVar7);
    pcVar6 = cmd_ln_get();
    pcVar7 = cmd_ln_str_r(pcVar6,"-moddeffn");
    iVar4 = model_def_read(&mdef,pcVar7);
    if (iVar4 == 0) {
      pcVar6 = cmd_ln_get();
      pcVar7 = cmd_ln_str_r(pcVar6,"-ts2cbfn");
      iVar5 = strcmp(".semi.",pcVar7);
      if (iVar5 == 0) {
        puVar11 = semi_ts2cb(mdef->n_tied_state);
        pmVar2 = mdef;
        mdef->cb = puVar11;
        local_3c = pmVar2->n_tied_state;
        local_40 = 1;
      }
      else {
        iVar5 = strcmp(".cont.",pcVar7);
        if (iVar5 == 0) {
          puVar11 = cont_ts2cb(mdef->n_tied_state);
          pmVar2 = mdef;
          mdef->cb = puVar11;
          local_40 = pmVar2->n_tied_state;
          local_3c = local_40;
        }
        else {
          iVar5 = strcmp(".ptm.",pcVar7);
          if (iVar5 == 0) {
            puVar11 = ptm_ts2cb(mdef);
            pmVar2 = mdef;
            mdef->cb = puVar11;
            local_3c = pmVar2->n_tied_state;
            local_40 = pmVar2->acmod_set->n_ci;
          }
          else {
            iVar5 = s3ts2cb_read(pcVar7,&mdef->cb,&local_3c,&local_40);
            if (iVar5 != 0) goto LAB_00103c5c;
          }
        }
      }
      pcVar6 = cmd_ln_get();
      pcVar7 = cmd_ln_str_r(pcVar6,"-dictfn");
      if (pcVar7 == (char *)0x0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
                ,0xcc,"You must specify a content dictionary using -dictfn\n");
        exit(1);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
              ,0xcf,"Reading %s\n",pcVar7);
      lex = lexicon_read((lexicon_t *)0x0,pcVar7,mdef->acmod_set);
      if (lex != (lexicon_t *)0x0) {
        pcVar6 = cmd_ln_get();
        pcVar7 = cmd_ln_str_r(pcVar6,"-fdictfn");
        if (pcVar7 != (char *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
                  ,0xda,"Reading %s\n",pcVar7);
          lexicon_read(lex,pcVar7,mdef->acmod_set);
        }
        goto LAB_00103eb2;
      }
    }
  }
LAB_00103c5c:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/main.c"
          ,0xe9,"Errors initializing.\n");
  return 1;
}

Assistant:

static int
initialize(int argc,
	   char *argv[])
{
    const char *fdictfn;
    const char *dictfn;
    const char *ts2cbfn;
    uint32 n_ts;
    uint32 n_cb;

    /* define, parse and (partially) validate the command line */
    parse_cmd_ln(argc, argv);

    feat = 
        feat_init(cmd_ln_str("-feat"),
                  cmn_type_from_str(cmd_ln_str("-cmn")),
                  cmd_ln_boolean("-varnorm"),
                  agc_type_from_str(cmd_ln_str("-agc")),
                  1, cmd_ln_int32("-ceplen"));


    if (cmd_ln_str("-lda")) {
        E_INFO("Reading linear feature transformation from %s\n",
               cmd_ln_str("-lda"));
        if (feat_read_lda(feat,
                          cmd_ln_str("-lda"),
                          cmd_ln_int32("-ldadim")) < 0)
            return -1;
    }

    if (cmd_ln_str("-svspec")) {
        int32 **subvecs;
        E_INFO("Using subvector specification %s\n", 
               cmd_ln_str("-svspec"));
        if ((subvecs = parse_subvecs(cmd_ln_str("-svspec"))) == NULL)
            return -1;
        if ((feat_set_subvecs(feat, subvecs)) < 0)
            return -1;
    }

    if (cmd_ln_exists("-agcthresh")
        && 0 != strcmp(cmd_ln_str("-agc"), "none")) {
        agc_set_threshold(feat->agc_struct,
                          cmd_ln_float32("-agcthresh"));
    }

    if (feat->cmn_struct
        && cmd_ln_exists("-cmninit")) {
        char *c, *cc, *vallist;
        int32 nvals;

        vallist = ckd_salloc(cmd_ln_str("-cmninit"));
        c = vallist;
        nvals = 0;
        while (nvals < feat->cmn_struct->veclen
               && (cc = strchr(c, ',')) != NULL) {
            *cc = '\0';
            feat->cmn_struct->cmn_mean[nvals] = FLOAT2MFCC(atof(c));
            c = cc + 1;
            ++nvals;
        }
        if (nvals < feat->cmn_struct->veclen && *c != '\0') {
            feat->cmn_struct->cmn_mean[nvals] = FLOAT2MFCC(atof(c));
        }
        ckd_free(vallist);
    }


    if (cmd_ln_str("-segdir"))
	corpus_set_seg_dir(cmd_ln_str("-segdir"));
    if (cmd_ln_str("-segext"))
	corpus_set_seg_ext(cmd_ln_str("-segext"));

    corpus_set_mfcc_dir(cmd_ln_str("-cepdir"));
    corpus_set_mfcc_ext(cmd_ln_str("-cepext"));

    if (cmd_ln_str("-lsnfn"))
	corpus_set_lsn_filename(cmd_ln_str("-lsnfn"));

    corpus_set_ctl_filename(cmd_ln_str("-ctlfn"));

    if (cmd_ln_int32("-nskip") && cmd_ln_int32("-runlen")) {
        corpus_set_interval(cmd_ln_int32("-nskip"),
			    cmd_ln_int32("-runlen"));
    } else if (cmd_ln_int32("-part") && cmd_ln_int32("-npart")) {
	corpus_set_partition(cmd_ln_int32("-part"),
			     cmd_ln_int32("-npart"));
    }
    

    if (corpus_init() != S3_SUCCESS) {
	return S3_ERROR;
    }
    
    if (cmd_ln_str("-moddeffn")) {
	E_INFO("Reading %s\n", cmd_ln_str("-moddeffn"));
    
	/* Read in the model definitions.  Defines the set of
	   CI phones and context dependent phones.  Defines the
	   transition matrix tying and state level tying. */
	if (model_def_read(&mdef,
			   cmd_ln_str("-moddeffn")) != S3_SUCCESS) {
	    return S3_ERROR;
	}
	
	ts2cbfn = cmd_ln_str("-ts2cbfn");
	if (strcmp(SEMI_LABEL, ts2cbfn) == 0) {
	    mdef->cb = semi_ts2cb(mdef->n_tied_state);
	    n_ts = mdef->n_tied_state;
	    n_cb = 1;
	}
	else if (strcmp(CONT_LABEL, ts2cbfn) == 0) {
	    mdef->cb = cont_ts2cb(mdef->n_tied_state);
	    n_ts = mdef->n_tied_state;
	    n_cb = mdef->n_tied_state;
	}
	else if (strcmp(PTM_LABEL, ts2cbfn) == 0) {
	    mdef->cb = ptm_ts2cb(mdef);
	    n_ts = mdef->n_tied_state;
	    n_cb = mdef->acmod_set->n_ci;
	}
	else if (s3ts2cb_read(ts2cbfn,
			      &mdef->cb,
			      &n_ts,
			      &n_cb) != S3_SUCCESS) {
	    return S3_ERROR;
	}

	dictfn = cmd_ln_str("-dictfn");

	if (dictfn == NULL) {
	    E_FATAL("You must specify a content dictionary using -dictfn\n");
	}

	E_INFO("Reading %s\n", dictfn);
	
	lex = lexicon_read(NULL,	/* no lexicon to start */
			   dictfn,
			   mdef->acmod_set);
	if (lex == NULL)
	    return S3_ERROR;
    
	fdictfn = cmd_ln_str("-fdictfn");

	if (fdictfn) {
	    E_INFO("Reading %s\n", fdictfn);
	    
	    (void)lexicon_read(lex,	/* add filler words content lexicon */
			       fdictfn,
			       mdef->acmod_set);
	}
    }

    return S3_SUCCESS;
}